

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O3

void __thiscall Imf_3_4::DeepTiledOutputFile::initialize(DeepTiledOutputFile *this,Header *header)

{
  int maxX;
  int minY;
  int maxY;
  ulong uVar1;
  char *pcVar2;
  pointer ppTVar3;
  LevelMode LVar4;
  LevelRoundingMode LVar5;
  uint uVar6;
  int iVar7;
  Format FVar8;
  LineOrder *pLVar9;
  TileDescription *pTVar10;
  Box2i *pBVar11;
  Compression *pCVar12;
  Compressor *pCVar13;
  TileBuffer *pTVar14;
  char *pcVar15;
  ArgExc *this_00;
  Data *pDVar16;
  ulong uVar17;
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  local_1d8;
  stringstream _iex_throw_s;
  int iStack_1b4;
  int local_1b0;
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  local_1a8 [15];
  
  Header::operator=(&this->_data->header,header);
  Header::setType(&this->_data->header,(string *)&DEEPTILE_abi_cxx11_);
  pLVar9 = Header::lineOrder(&this->_data->header);
  pDVar16 = this->_data;
  pDVar16->lineOrder = *pLVar9;
  pTVar10 = Header::tileDescription(&pDVar16->header);
  pDVar16 = this->_data;
  uVar6 = pTVar10->ySize;
  LVar4 = pTVar10->mode;
  LVar5 = pTVar10->roundingMode;
  (pDVar16->tileDesc).xSize = pTVar10->xSize;
  (pDVar16->tileDesc).ySize = uVar6;
  (pDVar16->tileDesc).mode = LVar4;
  (pDVar16->tileDesc).roundingMode = LVar5;
  pBVar11 = Header::dataWindow(&this->_data->header);
  iVar7 = (pBVar11->min).x;
  pDVar16 = this->_data;
  pDVar16->minX = iVar7;
  maxX = (pBVar11->max).x;
  pDVar16->maxX = maxX;
  minY = (pBVar11->min).y;
  pDVar16->minY = minY;
  maxY = (pBVar11->max).y;
  pDVar16->maxY = maxY;
  uVar6 = (pDVar16->tileDesc).xSize * (pDVar16->tileDesc).ySize;
  pDVar16->maxSampleCountTableSize = (ulong)uVar6 * 4;
  if (uVar6 < 0x40000000) {
    precalculateTileInfo
              (&pDVar16->tileDesc,iVar7,maxX,minY,maxY,&pDVar16->numXTiles,&pDVar16->numYTiles,
               &pDVar16->numXLevels,&pDVar16->numYLevels);
    pDVar16 = this->_data;
    if (pDVar16->lineOrder == INCREASING_Y) {
      iVar7 = 0;
    }
    else {
      iVar7 = *pDVar16->numYTiles + -1;
    }
    (pDVar16->nextTileToWrite).dx = 0;
    (pDVar16->nextTileToWrite).dy = iVar7;
    (pDVar16->nextTileToWrite).lx = 0;
    (pDVar16->nextTileToWrite).ly = 0;
    pCVar12 = Header::compression(&pDVar16->header);
    pCVar13 = newTileCompressor(*pCVar12,0,(ulong)(this->_data->tileDesc).ySize,&this->_data->header
                               );
    FVar8 = defaultFormat(pCVar13);
    pDVar16 = this->_data;
    pDVar16->format = FVar8;
    if (pCVar13 != (Compressor *)0x0) {
      (*pCVar13->_vptr_Compressor[1])(pCVar13);
      pDVar16 = this->_data;
    }
    TileOffsets::TileOffsets
              ((TileOffsets *)&_iex_throw_s,(pDVar16->tileDesc).mode,pDVar16->numXLevels,
               pDVar16->numYLevels,pDVar16->numXTiles,pDVar16->numYTiles);
    pDVar16 = this->_data;
    (pDVar16->tileOffsets)._numYLevels = local_1b0;
    (pDVar16->tileOffsets)._mode = __iex_throw_s;
    (pDVar16->tileOffsets)._numXLevels = iStack_1b4;
    local_1d8.
    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pDVar16->tileOffsets)._offsets.
         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (pDVar16->tileOffsets)._offsets.
    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_1a8[0].
         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1d8.
    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pDVar16->tileOffsets)._offsets.
         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_1d8.
    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pDVar16->tileOffsets)._offsets.
         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (pDVar16->tileOffsets)._offsets.
    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_1a8[0].
         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (pDVar16->tileOffsets)._offsets.
    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_1a8[0].
         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_1a8[0].
    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8[0].
    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8[0].
    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ::~vector(&local_1d8);
    std::
    vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ::~vector(local_1a8);
    pDVar16 = this->_data;
    iVar7 = getChunkOffsetTableSize(&pDVar16->header);
    Header::setChunkCount(&pDVar16->header,iVar7);
    if ((this->_data->tileBuffers).
        super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->_data->tileBuffers).
        super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar17 = 0;
      do {
        pTVar14 = (TileBuffer *)operator_new(0xb8);
        (pTVar14->buffer)._size = 0;
        (pTVar14->buffer)._data = (char *)0x0;
        pTVar14->dataPtr = (char *)0x0;
        pTVar14->dataSize = 0;
        pTVar14->compressor = (Compressor *)0x0;
        (pTVar14->sampleCountTableBuffer)._size = 0;
        (pTVar14->sampleCountTableBuffer)._data = (char *)0x0;
        pTVar14->sampleCountTablePtr = (char *)0x0;
        pTVar14->sampleCountTableCompressor = (Compressor *)0x0;
        (pTVar14->tileCoord).dx = 0;
        (pTVar14->tileCoord).dy = 0;
        *(undefined8 *)((long)&(pTVar14->tileCoord).dx + 1) = 0;
        *(undefined8 *)((long)&(pTVar14->tileCoord).lx + 1) = 0;
        (pTVar14->exception)._M_dataplus._M_p = (pointer)&(pTVar14->exception).field_2;
        (pTVar14->exception)._M_string_length = 0;
        (pTVar14->exception).field_2._M_local_buf[0] = '\0';
        IlmThread_3_4::Semaphore::Semaphore(&pTVar14->_sem,1);
        (this->_data->tileBuffers).
        super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar17] = pTVar14;
        pDVar16 = this->_data;
        uVar1 = pDVar16->maxSampleCountTableSize;
        pTVar14 = (pDVar16->tileBuffers).
                  super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar17];
        pcVar15 = (char *)operator_new__(uVar1);
        pcVar2 = (pTVar14->sampleCountTableBuffer)._data;
        if (pcVar2 != (char *)0x0) {
          operator_delete__(pcVar2);
          pDVar16 = this->_data;
        }
        (pTVar14->sampleCountTableBuffer)._size = uVar1;
        (pTVar14->sampleCountTableBuffer)._data = pcVar15;
        memset(((pDVar16->tileBuffers).
                super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar17]->sampleCountTableBuffer)._data,0,
               pDVar16->maxSampleCountTableSize);
        pCVar12 = Header::compression(&this->_data->header);
        pCVar13 = newCompressor(*pCVar12,this->_data->maxSampleCountTableSize,&this->_data->header);
        pDVar16 = this->_data;
        ppTVar3 = (pDVar16->tileBuffers).
                  super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppTVar3[uVar17]->sampleCountTableCompressor = pCVar13;
        uVar17 = uVar17 + 1;
      } while (uVar17 < (ulong)((long)(pDVar16->tileBuffers).
                                      super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar3 >>
                               3));
    }
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Deep tile size exceeds maximum permitted area",0x2d);
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,(stringstream *)&_iex_throw_s);
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
DeepTiledOutputFile::initialize (const Header& header)
{
    _data->header = header;
    _data->header.setType (DEEPTILE);
    _data->lineOrder = _data->header.lineOrder ();

    //
    // Check that the file is indeed tiled
    //

    _data->tileDesc = _data->header.tileDescription ();

    //
    // Save the dataWindow information
    //

    const Box2i& dataWindow = _data->header.dataWindow ();
    _data->minX             = dataWindow.min.x;
    _data->maxX             = dataWindow.max.x;
    _data->minY             = dataWindow.min.y;
    _data->maxY             = dataWindow.max.y;

    _data->maxSampleCountTableSize =
        _data->tileDesc.ySize * _data->tileDesc.xSize * sizeof (int);

    //
    // impose limit of 2^32 bytes of storage for maxSampleCountTableSize
    // (disallow files with very large tile areas that would otherwise cause excessive memory allocation)
    //

    if (_data->maxSampleCountTableSize >
        std::numeric_limits<unsigned int>::max ())
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Deep tile size exceeds maximum permitted area");
    }

    //
    // Precompute level and tile information to speed up utility functions
    //

    precalculateTileInfo (
        _data->tileDesc,
        _data->minX,
        _data->maxX,
        _data->minY,
        _data->maxY,
        _data->numXTiles,
        _data->numYTiles,
        _data->numXLevels,
        _data->numYLevels);

    //
    // Determine the first tile coordinate that we will be writing
    // if the file is not RANDOM_Y.
    //

    _data->nextTileToWrite = (_data->lineOrder == INCREASING_Y)
                                 ? TileCoord (0, 0, 0, 0)
                                 : TileCoord (0, _data->numYTiles[0] - 1, 0, 0);

    Compressor* compressor = newTileCompressor (
        _data->header.compression (), 0, _data->tileDesc.ySize, _data->header);

    _data->format = defaultFormat (compressor);

    if (compressor != 0) delete compressor;

    _data->tileOffsets = TileOffsets (
        _data->tileDesc.mode,
        _data->numXLevels,
        _data->numYLevels,
        _data->numXTiles,
        _data->numYTiles);

    //ignore the existing value of chunkCount - correct it if it's wrong
    _data->header.setChunkCount (getChunkOffsetTableSize (_data->header));

    for (size_t i = 0; i < _data->tileBuffers.size (); i++)
    {
        _data->tileBuffers[i] = new TileBuffer ();

        _data->tileBuffers[i]->sampleCountTableBuffer.resizeErase (
            static_cast<long> (_data->maxSampleCountTableSize));

        char* p = &(_data->tileBuffers[i]->sampleCountTableBuffer[0]);
        memset (p, 0, _data->maxSampleCountTableSize);

        _data->tileBuffers[i]->sampleCountTableCompressor = newCompressor (
            _data->header.compression (),
            _data->maxSampleCountTableSize,
            _data->header);
    }
}